

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomPoint::read(DomPoint *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringView tag;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QLatin1String *in_stack_ffffffffffffff00;
  QLatin1String *a;
  undefined2 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0a;
  byte in_stack_ffffffffffffff0b;
  QLatin1String *pQVar5;
  DomPoint *pDVar6;
  storage_type_conflict *in_stack_ffffffffffffff28;
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b8e0a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001b904c;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,
                 (QString *)
                 CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                         CONCAT12(in_stack_ffffffffffffff0a,
                                                  in_stack_ffffffffffffff08))));
      other.m_data = in_stack_ffffffffffffff28;
      other.m_size = (qsizetype)pDVar6;
      iVar3 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),other,
                         CaseInsensitive);
      in_stack_ffffffffffffff0b = iVar3 != 0 ^ 0xff;
      QString::~QString((QString *)0x1b8edc);
      if ((in_stack_ffffffffffffff0b & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)this,
                   (QString *)
                   CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                    in_stack_ffffffffffffff08))));
        other_00.m_data = in_stack_ffffffffffffff28;
        other_00.m_size = (qsizetype)pDVar6;
        iVar3 = QStringView::compare
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),other_00,
                           CaseInsensitive);
        in_stack_ffffffffffffff0a = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1b8f94);
        if ((in_stack_ffffffffffffff0a & 1) == 0) {
          pQVar5 = a;
          QVar4 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                                             CONCAT12(in_stack_ffffffffffffff0a,
                                                                      in_stack_ffffffffffffff08))),
                             (size_t)a);
          in_stack_ffffffffffffff28 = (storage_type_conflict *)QVar4.m_size;
          ::operator+(a,(QStringView *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                     );
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QXmlStreamReader::raiseError((QString *)a);
          QString::~QString((QString *)0x1b9041);
          in_stack_ffffffffffffff00 = a;
          a = pQVar5;
        }
        else {
          QXmlStreamReader::readElementText(local_98,a,0);
          iVar2 = QString::toInt((QString *)
                                 CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                                         CONCAT12(in_stack_ffffffffffffff0a,
                                                                  in_stack_ffffffffffffff08))),
                                 (bool *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          setElementY(this,iVar2);
          QString::~QString((QString *)0x1b8fd8);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_58,a,0);
        iVar2 = QString::toInt((QString *)
                               CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                                       CONCAT12(in_stack_ffffffffffffff0a,
                                                                in_stack_ffffffffffffff08))),
                               (bool *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        setElementX(this,iVar2);
        QString::~QString((QString *)0x1b8f29);
      }
    }
  } while (iVar2 != 5);
LAB_001b904c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomPoint::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"x"_s, Qt::CaseInsensitive)) {
                setElementX(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"y"_s, Qt::CaseInsensitive)) {
                setElementY(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}